

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O0

bool __thiscall benchmark::Regex::Match(Regex *this,string *str)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool local_1;
  
  if (((byte)in_RDI->_M_dataplus & 1) == 0) {
    local_1 = false;
  }
  else {
    local_1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (in_RDI,in_RSI,(match_flag_type)((ulong)in_RDI >> 0x20));
  }
  return local_1;
}

Assistant:

bool Regex::Match(const std::string& str) {
  if (!init_) {
    return false;
  }

  return std::regex_search(str, re_);
}